

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdsSTR::gdsSTR(gdsSTR *this)

{
  allocator<char> local_11;
  gdsSTR *local_10;
  gdsSTR *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->heirarchical_level = 0;
  this->bounding_box[0] = 0;
  this->bounding_box[1] = 0;
  this->bounding_box[2] = 0;
  this->bounding_box[3] = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->last_modified);
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::vector(&this->BOUNDARY);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::vector(&this->PATH);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::vector(&this->SREF);
  std::vector<gdsAREF,_std::allocator<gdsAREF>_>::vector(&this->AREF);
  std::vector<gdsTEXT,_std::allocator<gdsTEXT>_>::vector(&this->TEXT);
  std::vector<gdsNODE,_std::allocator<gdsNODE>_>::vector(&this->NODE);
  std::vector<gdsBOX,_std::allocator<gdsBOX>_>::vector(&this->BOX);
  return;
}

Assistant:

gdsSTR(){}